

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int trex_parsenumber(TRex *exp)

{
  char cVar1;
  ushort **ppuVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar5 = exp->_p;
  iVar4 = *pcVar5 + -0x30;
  exp->_p = pcVar5 + 1;
  ppuVar2 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar2 + (long)pcVar5[1] * 2 + 1) & 8) != 0) {
    pcVar5 = pcVar5 + 2;
    iVar3 = 10;
    do {
      exp->_p = pcVar5;
      if (iVar3 == 1000000000) {
        if (exp->_error != (char **)0x0) {
          *exp->_error = "overflow in numeric constant";
        }
        longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
      }
      iVar4 = (int)pcVar5[-1] + iVar4 * 10 + -0x30;
      iVar3 = iVar3 * 10;
      cVar1 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 8) != 0);
  }
  return iVar4;
}

Assistant:

static int trex_parsenumber(TRex* exp) {
    int ret = *exp->_p - '0';
    int positions = 10;
    exp->_p++;
    while (isdigit((int)(*exp->_p))) {
        ret = ret * 10 + (*exp->_p++ - '0');
        if (positions == 1000000000)
            trex_error(exp, _SC("overflow in numeric constant"));
        positions *= 10;
    };
    return ret;
}